

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O2

void __thiscall
slang::ast::MinTypMaxExpression::visitExprs<slang::analysis::NonProceduralExprVisitor&>
          (MinTypMaxExpression *this,Result *visitor)

{
  Expression::visit<slang::analysis::NonProceduralExprVisitor&>(this->min_,visitor);
  Expression::visit<slang::analysis::NonProceduralExprVisitor&>(this->typ_,visitor);
  Expression::visit<slang::analysis::NonProceduralExprVisitor&>(this->max_,visitor);
  return;
}

Assistant:

decltype(auto) visitExprs(TVisitor&& visitor) const {
        min().visit(visitor);
        typ().visit(visitor);
        max().visit(visitor);
    }